

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O2

void __thiscall Preprocessor::Preprocessor(Preprocessor *this,string *prog_path,string *data_path)

{
  undefined8 uVar1;
  string local_f0 [8];
  string prog_filename;
  string prog_filename_without_extension;
  string data_filename_without_extension;
  undefined1 local_70 [8];
  string data_filename;
  
  (this->p_path)._M_dataplus._M_p = (pointer)&(this->p_path).field_2;
  (this->p_path)._M_string_length = 0;
  (this->p_path).field_2._M_local_buf[0] = '\0';
  (this->p_A_path)._M_dataplus._M_p = (pointer)&(this->p_A_path).field_2;
  (this->p_A_path)._M_string_length = 0;
  (this->p_A_path).field_2._M_local_buf[0] = '\0';
  (this->p_B_path)._M_dataplus._M_p = (pointer)&(this->p_B_path).field_2;
  (this->p_B_path)._M_string_length = 0;
  (this->p_B_path).field_2._M_local_buf[0] = '\0';
  (this->d_path)._M_dataplus._M_p = (pointer)&(this->d_path).field_2;
  (this->d_path)._M_string_length = 0;
  (this->d_path).field_2._M_local_buf[0] = '\0';
  data_filename.field_2._8_8_ = &this->d_A_path;
  (this->d_A_path)._M_dataplus._M_p = (pointer)&(this->d_A_path).field_2;
  (this->d_A_path)._M_string_length = 0;
  (this->d_A_path).field_2._M_local_buf[0] = '\0';
  (this->d_B_path)._M_dataplus._M_p = (pointer)&(this->d_B_path).field_2;
  (this->d_B_path)._M_string_length = 0;
  (this->d_B_path).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::assign((char *)&this->p_A_path);
  std::__cxx11::string::assign((char *)&this->p_B_path);
  std::__cxx11::string::_M_assign((string *)this);
  std::__cxx11::string::find_last_of((char *)prog_path,0x103024);
  std::__cxx11::string::substr((ulong)local_f0,(ulong)prog_path);
  std::__cxx11::string::rfind((char)local_f0,0x2e);
  uVar1 = data_filename.field_2._8_8_;
  std::__cxx11::string::substr((ulong)((long)&prog_filename.field_2 + 8),(ulong)local_f0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&prog_filename.field_2 + 8),"_A.txt");
  std::__cxx11::string::append((string *)&this->p_A_path);
  std::__cxx11::string::~string((string *)local_70);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&prog_filename.field_2 + 8),"_B.txt");
  std::__cxx11::string::append((string *)&this->p_B_path);
  std::__cxx11::string::~string((string *)local_70);
  std::__cxx11::string::assign((char *)uVar1);
  std::__cxx11::string::assign((char *)&this->d_B_path);
  std::__cxx11::string::_M_assign((string *)&this->d_path);
  std::__cxx11::string::find_last_of((char *)data_path,0x103024);
  std::__cxx11::string::substr((ulong)local_70,(ulong)data_path);
  std::__cxx11::string::rfind((char)local_70,0x2e);
  std::__cxx11::string::substr
            ((ulong)((long)&prog_filename_without_extension.field_2 + 8),(ulong)local_70);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&data_filename_without_extension.field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&prog_filename_without_extension.field_2 + 8),"_A.txt");
  std::__cxx11::string::append((string *)uVar1);
  std::__cxx11::string::~string
            ((string *)(data_filename_without_extension.field_2._M_local_buf + 8));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&data_filename_without_extension.field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&prog_filename_without_extension.field_2 + 8),"_B.txt");
  std::__cxx11::string::append((string *)&this->d_B_path);
  std::__cxx11::string::~string
            ((string *)(data_filename_without_extension.field_2._M_local_buf + 8));
  std::__cxx11::string::~string
            ((string *)(prog_filename_without_extension.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_70);
  std::__cxx11::string::~string((string *)(prog_filename.field_2._M_local_buf + 8));
  std::__cxx11::string::~string(local_f0);
  return;
}

Assistant:

Preprocessor::Preprocessor(std::string prog_path, std::string data_path)
{
  p_A_path = "../inputs/alice/";
  p_B_path = "../inputs/bob/";
  p_path = prog_path;
  std::string prog_filename = prog_path.substr(prog_path.find_last_of("/\\") + 1);
  std::string::size_type const p(prog_filename.find_last_of('.'));
  std::string prog_filename_without_extension = prog_filename.substr(0, p);
  p_A_path.append(prog_filename_without_extension + "_A.txt");
  p_B_path.append(prog_filename_without_extension + "_B.txt");

  d_A_path = "../inputs/alice/";
  d_B_path = "../inputs/bob/";
  d_path = data_path;
  std::string data_filename = data_path.substr(data_path.find_last_of("/\\") + 1);
  std::string::size_type const q(data_filename.find_last_of('.'));
  std::string data_filename_without_extension = data_filename.substr(0, q);
  d_A_path.append(data_filename_without_extension + "_A.txt");
  d_B_path.append(data_filename_without_extension + "_B.txt");
  
}